

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.cpp
# Opt level: O0

shared_ptr<gmlc::networking::TcpServer> __thiscall
helics::apps::AsioBrokerServer::loadTCPserver(AsioBrokerServer *this,io_context *ioctx)

{
  bool bVar1;
  int iVar2;
  string *key;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char *in_RSI;
  element_type *in_RDI;
  shared_ptr<gmlc::networking::TcpServer> sVar3;
  value_type *V;
  int tcpport;
  string ext_interface;
  pointer *server;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  char (*in_stack_ffffffffffffff28) [4];
  undefined4 in_stack_ffffffffffffff30;
  undefined4 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  uint6 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5e;
  allocator<char> in_stack_ffffffffffffff5f;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_ffffffffffffff60;
  string local_79;
  string *local_58;
  int local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_39;
  
  this_00 = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,in_RSI,(allocator<char> *)in_RDI);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  iVar2 = getDefaultPort(6);
  local_50 = iVar2;
  bVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[4],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)CONCAT44(iVar2,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28);
  uVar5 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff30);
  if (bVar1) {
    key = (string *)
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::operator[]<char_const>
                    (in_stack_ffffffffffffff60,
                     (char *)CONCAT17(in_stack_ffffffffffffff5f,
                                      CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58))
                    );
    psVar4 = &local_79;
    local_58 = key;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,in_RSI,(allocator<char> *)in_RDI);
    fileops::replaceIfMember((json *)CONCAT44(iVar2,uVar5),key,psVar4);
    std::__cxx11::string::~string(in_stack_ffffffffffffff10);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    in_stack_ffffffffffffff10 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &stack0xffffffffffffff5f;
    psVar4 = local_58;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,in_RSI,(allocator<char> *)in_RDI);
    fileops::replaceIfMember((json *)in_stack_ffffffffffffff10,psVar4,(int *)0x202468);
    std::__cxx11::string::~string(in_stack_ffffffffffffff10);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5f);
  }
  gmlc::networking::TcpServer::create
            ((io_context *)CONCAT17(in_stack_ffffffffffffff5f,(uint7)in_stack_ffffffffffffff58),
             (string *)this_00,(uint16_t)((ulong)in_RSI >> 0x30),SUB81((ulong)in_RSI >> 0x28,0),
             (int)in_RSI);
  std::__cxx11::string::~string(in_stack_ffffffffffffff10);
  sVar3.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<gmlc::networking::TcpServer>)
         sVar3.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<gmlc::networking::TcpServer>
        AsioBrokerServer::loadTCPserver(asio::io_context& ioctx)
    {
        std::string ext_interface = "0.0.0.0";
        int tcpport = getDefaultPort(HELICS_CORE_TYPE_TCP);
        // std::chrono::milliseconds timeout(20000);
        if (config_->contains("tcp")) {
            const auto& V = (*config_)["tcp"];
            helics::fileops::replaceIfMember(V, "interface", ext_interface);
            helics::fileops::replaceIfMember(V, "port", tcpport);
        }
        auto server = gmlc::networking::TcpServer::create(
            ioctx, ext_interface, static_cast<uint16_t>(tcpport), true, 2048);
        return server;
    }